

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

string * QStringConverterICU::nul_terminate_impl_abi_cxx11_(QStringView name)

{
  size_type __n;
  size_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_898f2789 local_30;
  QStringView local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->field_2)._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&in_RDI->field_2 + 8) = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  local_30.name = &local_28;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (in_RDI,in_RSI);
  __n = nul_terminate_impl::anon_class_8_1_898f2789::operator()
                  (&local_30,(in_RDI->_M_dataplus)._M_p,in_RDI->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (in_RDI,__n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string nul_terminate_impl(QStringView name)
    {
        std::string result;
        const auto convert = [&](char *p, size_t n) {
                const auto sz = QLatin1::convertFromUnicode(p, name) - p;
                Q_ASSERT(q20::cmp_less_equal(sz, n));
                return sz;
            };
#ifdef __cpp_lib_string_resize_and_overwrite
        result.resize_and_overwrite(size_t(name.size()), convert);
#else
        result.resize(size_t(name.size()));
        result.resize(convert(result.data(), result.size()));
#endif // __cpp_lib_string_resize_and_overwrite
        return result;
    }